

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarScrollToTab(ImGuiTabBar *tab_bar,ImGuiID tab_id,ImGuiTabBarSection *sections)

{
  int iVar1;
  ImGuiTabItem *tab_00;
  float fVar2;
  float fVar3;
  float local_54;
  float local_4c;
  float tab_x2;
  float tab_x1;
  float scrollable_width;
  int order;
  float margin;
  ImGuiContext *g;
  ImGuiTabItem *tab;
  ImGuiTabBarSection *sections_local;
  ImGuiID tab_id_local;
  ImGuiTabBar *tab_bar_local;
  
  tab_00 = TabBarFindTabByID(tab_bar,tab_id);
  if ((tab_00 != (ImGuiTabItem *)0x0) && ((tab_00->Flags & 0xc0U) == 0)) {
    local_54 = GImGui->FontSize * 1.0;
    iVar1 = ImGuiTabBar::GetTabOrder(tab_bar,tab_00);
    fVar2 = ImRect::GetWidth(&tab_bar->BarRect);
    fVar2 = ((fVar2 - sections->Width) - sections[2].Width) - sections[1].Spacing;
    if (sections->TabCount + -1 < iVar1) {
      local_4c = -local_54;
    }
    else {
      local_4c = 0.0;
    }
    local_4c = (tab_00->Offset - sections->Width) + local_4c;
    if ((tab_bar->Tabs).Size - sections[2].TabCount <= iVar1 + 1) {
      local_54 = 1.0;
    }
    local_54 = (tab_00->Offset - sections->Width) + tab_00->Width + local_54;
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    if ((local_4c < tab_bar->ScrollingTarget) || (fVar2 <= local_54 - local_4c)) {
      fVar2 = ImMax<float>(tab_bar->ScrollingAnim - local_54,0.0);
      tab_bar->ScrollingTargetDistToVisibility = fVar2;
      tab_bar->ScrollingTarget = local_4c;
    }
    else if (tab_bar->ScrollingTarget < local_54 - fVar2) {
      fVar3 = ImMax<float>((local_4c - fVar2) - tab_bar->ScrollingAnim,0.0);
      tab_bar->ScrollingTargetDistToVisibility = fVar3;
      tab_bar->ScrollingTarget = local_54 - fVar2;
    }
  }
  return;
}

Assistant:

static void ImGui::TabBarScrollToTab(ImGuiTabBar* tab_bar, ImGuiID tab_id, ImGuiTabBarSection* sections)
{
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id);
    if (tab == NULL)
        return;
    if (tab->Flags & ImGuiTabItemFlags_SectionMask_)
        return;

    ImGuiContext& g = *GImGui;
    float margin = g.FontSize * 1.0f; // When to scroll to make Tab N+1 visible always make a bit of N visible to suggest more scrolling area (since we don't have a scrollbar)
    int order = tab_bar->GetTabOrder(tab);

    // Scrolling happens only in the central section (leading/trailing sections are not scrolling)
    // FIXME: This is all confusing.
    float scrollable_width = tab_bar->BarRect.GetWidth() - sections[0].Width - sections[2].Width - sections[1].Spacing;

    // We make all tabs positions all relative Sections[0].Width to make code simpler
    float tab_x1 = tab->Offset - sections[0].Width + (order > sections[0].TabCount - 1 ? -margin : 0.0f);
    float tab_x2 = tab->Offset - sections[0].Width + tab->Width + (order + 1 < tab_bar->Tabs.Size - sections[2].TabCount ? margin : 1.0f);
    tab_bar->ScrollingTargetDistToVisibility = 0.0f;
    if (tab_bar->ScrollingTarget > tab_x1 || (tab_x2 - tab_x1 >= scrollable_width))
    {
        // Scroll to the left
        tab_bar->ScrollingTargetDistToVisibility = ImMax(tab_bar->ScrollingAnim - tab_x2, 0.0f);
        tab_bar->ScrollingTarget = tab_x1;
    }
    else if (tab_bar->ScrollingTarget < tab_x2 - scrollable_width)
    {
        // Scroll to the right
        tab_bar->ScrollingTargetDistToVisibility = ImMax((tab_x1 - scrollable_width) - tab_bar->ScrollingAnim, 0.0f);
        tab_bar->ScrollingTarget = tab_x2 - scrollable_width;
    }
}